

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9ParseIniString(jx9_context *pCtx,char *zIn,sxu32 nByte,int bProcessSection)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  jx9_value *pArray_00;
  jx9_value *pVal;
  jx9_value *pVal_00;
  ushort **ppuVar4;
  byte *pbVar5;
  jx9_value *pjVar6;
  SyHashEntry *pSVar7;
  bool bVar8;
  bool bVar9;
  jx9_value *local_f8;
  jx9_value *local_d8;
  jx9_value *pvArr;
  int iLen;
  int is_array;
  jx9_value *pOldCur;
  undefined1 local_b8 [4];
  int c;
  SyHash sHash;
  SyString sEntry;
  SyHashEntry *pEntry;
  char *zEnd;
  char *zCur;
  jx9_value *pValue;
  jx9_value *pWorker;
  jx9_value *pSection;
  jx9_value *pArray;
  jx9_value *pCur;
  int bProcessSection_local;
  sxu32 nByte_local;
  char *zIn_local;
  jx9_context *pCtx_local;
  
  pbVar3 = (byte *)(zIn + nByte);
  pArray_00 = jx9_context_new_array(pCtx);
  pVal = jx9_context_new_scalar(pCtx);
  pVal_00 = jx9_context_new_scalar(pCtx);
  if (((pArray_00 == (jx9_value *)0x0) || (pVal == (jx9_value *)0x0)) ||
     (pVal_00 == (jx9_value *)0x0)) {
    jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
    jx9_result_bool(pCtx,0);
  }
  else {
    SyHashInit((SyHash *)local_b8,&pCtx->pVm->sAllocator,(ProcHash)0x0,(ProcCmp)0x0);
    _bProcessSection_local = (byte *)zIn;
    pjVar6 = pArray_00;
    while( true ) {
      while( true ) {
        pArray = pjVar6;
        pbVar5 = _bProcessSection_local;
        pjVar6 = pArray;
        bVar8 = false;
        if ((_bProcessSection_local < pbVar3) && (bVar8 = false, *_bProcessSection_local < 0xc0)) {
          ppuVar4 = __ctype_b_loc();
          bVar8 = ((*ppuVar4)[(int)(char)*_bProcessSection_local] & 0x2000) != 0;
        }
        if (!bVar8) break;
        _bProcessSection_local = _bProcessSection_local + 1;
      }
      if (pbVar3 <= _bProcessSection_local) break;
      if ((*_bProcessSection_local == 0x3b) || (*_bProcessSection_local == 0x23)) {
        do {
          _bProcessSection_local = _bProcessSection_local + 1;
          bVar8 = false;
          if (_bProcessSection_local < pbVar3) {
            bVar8 = *_bProcessSection_local != 10;
          }
        } while (bVar8);
      }
      else {
        jx9_value_reset_string_cursor(pVal);
        if (*_bProcessSection_local == 0x5b) {
          pbVar5 = _bProcessSection_local + 1;
          _bProcessSection_local = pbVar5;
          while( true ) {
            bVar8 = false;
            if (_bProcessSection_local < pbVar3) {
              bVar8 = *_bProcessSection_local != 0x5d;
            }
            if (!bVar8) break;
            _bProcessSection_local = _bProcessSection_local + 1;
          }
          if ((pbVar5 < _bProcessSection_local) && (bProcessSection != 0)) {
            sEntry.zString._0_4_ = (int)_bProcessSection_local - (int)pbVar5;
            sHash._56_8_ = pbVar5;
            while( true ) {
              bVar8 = false;
              if (((sxu32)sEntry.zString != 0) && (bVar8 = false, *(byte *)sHash._56_8_ < 0xc0)) {
                ppuVar4 = __ctype_b_loc();
                bVar8 = ((*ppuVar4)[(int)*(char *)sHash._56_8_] & 0x2000) != 0;
              }
              if (!bVar8) break;
              sEntry.zString._0_4_ = (sxu32)sEntry.zString + -1;
              sHash._56_8_ = sHash._56_8_ + 1;
            }
            while( true ) {
              bVar8 = false;
              if (((sxu32)sEntry.zString != 0) &&
                 (bVar8 = false, *(byte *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1)) < 0xc0
                 )) {
                ppuVar4 = __ctype_b_loc();
                bVar8 = ((*ppuVar4)
                         [(int)*(char *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1))] &
                        0x2000) != 0;
              }
              if (!bVar8) break;
              sEntry.zString._0_4_ = (sxu32)sEntry.zString + -1;
            }
            jx9_value_string(pVal,(char *)sHash._56_8_,(sxu32)sEntry.zString);
            if (((sxu32)sEntry.zString != 0) &&
               (pjVar6 = jx9_context_new_array(pCtx), pjVar6 != (jx9_value *)0x0)) {
              jx9_array_add_elem(pArray_00,pVal,pjVar6);
              pArray = pjVar6;
            }
          }
          _bProcessSection_local = _bProcessSection_local + 1;
          pjVar6 = pArray;
        }
        else {
          bVar8 = false;
          pvArr._0_4_ = 0;
          while( true ) {
            bVar9 = false;
            if (_bProcessSection_local < pbVar3) {
              bVar9 = *_bProcessSection_local != 0x3d;
            }
            if (!bVar9) break;
            if ((*_bProcessSection_local == 0x5b) && (!bVar8)) {
              pvArr._0_4_ = (int)_bProcessSection_local - (int)pbVar5;
              bVar8 = true;
              if (0 < (int)(sxu32)pvArr) {
                sHash._56_8_ = pbVar5;
                sEntry.zString._0_4_ = (sxu32)pvArr;
                while( true ) {
                  bVar9 = false;
                  if (((sxu32)sEntry.zString != 0) && (bVar9 = false, *(byte *)sHash._56_8_ < 0xc0))
                  {
                    ppuVar4 = __ctype_b_loc();
                    bVar9 = ((*ppuVar4)[(int)*(char *)sHash._56_8_] & 0x2000) != 0;
                  }
                  if (!bVar9) break;
                  sEntry.zString._0_4_ = (sxu32)sEntry.zString - 1;
                  sHash._56_8_ = sHash._56_8_ + 1;
                }
                while( true ) {
                  bVar9 = false;
                  if (((sxu32)sEntry.zString != 0) &&
                     (bVar9 = false,
                     *(byte *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1)) < 0xc0)) {
                    ppuVar4 = __ctype_b_loc();
                    bVar9 = ((*ppuVar4)
                             [(int)*(char *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1))] &
                            0x2000) != 0;
                  }
                  if (!bVar9) break;
                  sEntry.zString._0_4_ = (sxu32)sEntry.zString - 1;
                }
                pSVar7 = SyHashGet((SyHash *)local_b8,(void *)sHash._56_8_,(sxu32)sEntry.zString);
                if (pSVar7 == (SyHashEntry *)0x0) {
                  local_d8 = jx9_context_new_array(pCtx);
                  if (local_d8 != (jx9_value *)0x0) {
                    SyHashInsert((SyHash *)local_b8,(void *)sHash._56_8_,(sxu32)sEntry.zString,
                                 local_d8);
                    jx9_value_reset_string_cursor(pVal);
                    jx9_value_string(pVal,(char *)sHash._56_8_,(sxu32)sEntry.zString);
                    jx9_array_add_elem(pArray,pVal,local_d8);
                    jx9_value_reset_string_cursor(pVal);
                  }
                }
                else {
                  local_d8 = (jx9_value *)pSVar7->pUserData;
                }
                if (local_d8 != (jx9_value *)0x0) {
                  pArray = local_d8;
                }
              }
              while( true ) {
                bVar9 = false;
                if (_bProcessSection_local < pbVar3) {
                  bVar9 = *_bProcessSection_local != 0x5d;
                }
                if (!bVar9) break;
                _bProcessSection_local = _bProcessSection_local + 1;
              }
            }
            _bProcessSection_local = _bProcessSection_local + 1;
          }
          if (!bVar8) {
            pvArr._0_4_ = (int)_bProcessSection_local - (int)pbVar5;
          }
          sHash._56_8_ = pbVar5;
          sEntry.zString._0_4_ = (sxu32)pvArr;
          while( true ) {
            bVar9 = false;
            if (((sxu32)sEntry.zString != 0) && (bVar9 = false, *(byte *)sHash._56_8_ < 0xc0)) {
              ppuVar4 = __ctype_b_loc();
              bVar9 = ((*ppuVar4)[(int)*(char *)sHash._56_8_] & 0x2000) != 0;
            }
            if (!bVar9) break;
            sEntry.zString._0_4_ = (sxu32)sEntry.zString - 1;
            sHash._56_8_ = sHash._56_8_ + 1;
          }
          while( true ) {
            bVar9 = false;
            if (((sxu32)sEntry.zString != 0) &&
               (bVar9 = false, *(byte *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1)) < 0xc0))
            {
              ppuVar4 = __ctype_b_loc();
              bVar9 = ((*ppuVar4)[(int)*(char *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1))]
                      & 0x2000) != 0;
            }
            if (!bVar9) break;
            sEntry.zString._0_4_ = (sxu32)sEntry.zString - 1;
          }
          if ((sxu32)sEntry.zString == 0) {
            while( true ) {
              bVar8 = false;
              if ((_bProcessSection_local < pbVar3) &&
                 (bVar8 = false, *_bProcessSection_local < 0xc0)) {
                ppuVar4 = __ctype_b_loc();
                bVar8 = true;
                if (((*ppuVar4)[(int)(char)*_bProcessSection_local] & 0x2000) == 0) {
                  bVar8 = *_bProcessSection_local == 0x3d;
                }
              }
              if (!bVar8) break;
              _bProcessSection_local = _bProcessSection_local + 1;
            }
          }
          else {
            if (!bVar8) {
              jx9_value_string(pVal,(char *)sHash._56_8_,(sxu32)sEntry.zString);
            }
            jx9_value_reset_string_cursor(pVal_00);
            do {
              pbVar5 = _bProcessSection_local;
              _bProcessSection_local = pbVar5 + 1;
              pbVar2 = _bProcessSection_local;
              bVar9 = false;
              if ((_bProcessSection_local < pbVar3) &&
                 (bVar9 = false, *_bProcessSection_local < 0xc0)) {
                ppuVar4 = __ctype_b_loc();
                bVar9 = ((*ppuVar4)[(int)(char)*_bProcessSection_local] & 0x2000) != 0;
              }
            } while (bVar9);
            if (_bProcessSection_local < pbVar3) {
              bVar1 = *_bProcessSection_local;
              if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
                for (_bProcessSection_local = pbVar5 + 2;
                    (_bProcessSection_local < pbVar3 &&
                    ((*_bProcessSection_local != bVar1 || (_bProcessSection_local[-1] == 0x5c))));
                    _bProcessSection_local = _bProcessSection_local + 1) {
                }
                if (_bProcessSection_local < pbVar3) {
                  _bProcessSection_local = _bProcessSection_local + 1;
                }
              }
              else {
                for (; _bProcessSection_local < pbVar3;
                    _bProcessSection_local = _bProcessSection_local + 1) {
                  if (*_bProcessSection_local == 10) {
                    if (_bProcessSection_local[-1] != 0x5c) break;
                  }
                  else if ((*_bProcessSection_local == 0x3b) || (*_bProcessSection_local == 0x23))
                  break;
                }
              }
              sHash._56_8_ = pbVar2;
              sEntry.zString._0_4_ = (int)_bProcessSection_local - (int)pbVar2;
              while( true ) {
                bVar9 = false;
                if (((sxu32)sEntry.zString != 0) && (bVar9 = false, *(byte *)sHash._56_8_ < 0xc0)) {
                  ppuVar4 = __ctype_b_loc();
                  bVar9 = ((*ppuVar4)[(int)*(char *)sHash._56_8_] & 0x2000) != 0;
                }
                if (!bVar9) break;
                sEntry.zString._0_4_ = (sxu32)sEntry.zString + -1;
                sHash._56_8_ = sHash._56_8_ + 1;
              }
              while( true ) {
                bVar9 = false;
                if (((sxu32)sEntry.zString != 0) &&
                   (bVar9 = false,
                   *(byte *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1)) < 0xc0)) {
                  ppuVar4 = __ctype_b_loc();
                  bVar9 = ((*ppuVar4)
                           [(int)*(char *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1))] &
                          0x2000) != 0;
                }
                if (!bVar9) break;
                sEntry.zString._0_4_ = (sxu32)sEntry.zString + -1;
              }
              if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
                while( true ) {
                  bVar9 = false;
                  if ((sxu32)sEntry.zString != 0) {
                    bVar9 = *(byte *)sHash._56_8_ == bVar1;
                  }
                  if (!bVar9) break;
                  sHash._56_8_ = sHash._56_8_ + 1;
                  sEntry.zString._0_4_ = (sxu32)sEntry.zString + -1;
                }
                while( true ) {
                  bVar9 = false;
                  if ((sxu32)sEntry.zString != 0) {
                    bVar9 = *(byte *)(sHash._56_8_ + (ulong)((sxu32)sEntry.zString - 1)) == bVar1;
                  }
                  if (!bVar9) break;
                  sEntry.zString._0_4_ = (sxu32)sEntry.zString + -1;
                }
              }
              if ((sxu32)sEntry.zString != 0) {
                jx9_value_string(pVal_00,(char *)sHash._56_8_,(sxu32)sEntry.zString);
              }
              local_f8 = pVal;
              if (bVar8) {
                local_f8 = (jx9_value *)0x0;
              }
              jx9_array_add_elem(pArray,local_f8,pVal_00);
            }
          }
        }
      }
    }
    SyHashRelease((SyHash *)local_b8);
    jx9_result_value(pCtx,pArray_00);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9ParseIniString(jx9_context *pCtx, const char *zIn, sxu32 nByte, int bProcessSection)
{
	jx9_value *pCur, *pArray, *pSection, *pWorker, *pValue;
	const char *zCur, *zEnd = &zIn[nByte];
	SyHashEntry *pEntry;
	SyString sEntry;
	SyHash sHash;
	int c;
	/* Create an empty array and worker variables */
	pArray = jx9_context_new_array(pCtx);
	pWorker = jx9_context_new_scalar(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pWorker == 0 || pValue == 0){
		/* Out of memory */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	SyHashInit(&sHash, &pCtx->pVm->sAllocator, 0, 0);
	pCur = pArray;
	/* Start the parse process */
	for(;;){
		/* Ignore leading white spaces */
		while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0])){
			zIn++;
		}
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		if( zIn[0] == ';' || zIn[0] == '#' ){
			/* Comment til the end of line */
			zIn++;
			while(zIn < zEnd && zIn[0] != '\n' ){
				zIn++;
			}
			continue;
		}
		/* Reset the string cursor of the working variable */
		jx9_value_reset_string_cursor(pWorker);
		if( zIn[0] == '[' ){
			/* Section: Extract the section name */
			zIn++;
			zCur = zIn;
			while( zIn < zEnd && zIn[0] != ']' ){
				zIn++;
			}
			if( zIn > zCur && bProcessSection ){
				/* Save the section name */
				SyStringInitFromBuf(&sEntry, zCur, (int)(zIn-zCur));
				SyStringFullTrim(&sEntry);
				jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
				if( sEntry.nByte > 0 ){
					/* Associate an array with the section */
					pSection = jx9_context_new_array(pCtx);
					if( pSection ){
						jx9_array_add_elem(pArray, pWorker/*Section name*/, pSection);
						pCur = pSection;
					}
				}
			}
			zIn++; /* Trailing square brackets ']' */
		}else{
			jx9_value *pOldCur;
			int is_array;
			int iLen;
			/* Properties */
			is_array = 0;
			zCur = zIn;
			iLen = 0; /* cc warning */
			pOldCur = pCur;
			while( zIn < zEnd && zIn[0] != '=' ){
				if( zIn[0] == '[' && !is_array ){
					/* Array */
					iLen = (int)(zIn-zCur);
					is_array = 1;
					if( iLen > 0 ){
						jx9_value *pvArr = 0; /* cc warning */
						/* Query the hashtable */
						SyStringInitFromBuf(&sEntry, zCur, iLen);
						SyStringFullTrim(&sEntry);
						pEntry = SyHashGet(&sHash, (const void *)sEntry.zString, sEntry.nByte);
						if( pEntry ){
							pvArr = (jx9_value *)SyHashEntryGetUserData(pEntry);
						}else{
							/* Create an empty array */
							pvArr = jx9_context_new_array(pCtx);
							if( pvArr ){
								/* Save the entry */
								SyHashInsert(&sHash, (const void *)sEntry.zString, sEntry.nByte, pvArr);
								/* Insert the entry */
								jx9_value_reset_string_cursor(pWorker);
								jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
								jx9_array_add_elem(pCur, pWorker, pvArr);
								jx9_value_reset_string_cursor(pWorker);
							}
						}
						if( pvArr ){
							pCur = pvArr;
						}
					}
					while ( zIn < zEnd && zIn[0] != ']' ){
						zIn++;
					}
				}
				zIn++;
			}
			if( !is_array ){
				iLen = (int)(zIn-zCur);
			}
			/* Trim the key */
			SyStringInitFromBuf(&sEntry, zCur, iLen);
			SyStringFullTrim(&sEntry);
			if( sEntry.nByte > 0 ){
				if( !is_array ){
					/* Save the key name */
					jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
				}
				/* extract key value */
				jx9_value_reset_string_cursor(pValue);
				zIn++; /* '=' */
				while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
					zIn++;
				}
				if( zIn < zEnd ){
					zCur = zIn;
					c = zIn[0];
					if( c == '"' || c == '\'' ){
						zIn++;
						/* Delimit the value */
						while( zIn < zEnd ){
							if ( zIn[0] == c && zIn[-1] != '\\' ){
								break;
							}
							zIn++;
						}
						if( zIn < zEnd ){
							zIn++;
						}
					}else{
						while( zIn < zEnd ){
							if( zIn[0] == '\n' ){
								if( zIn[-1] != '\\' ){
									break;
								}
							}else if( zIn[0] == ';' || zIn[0] == '#' ){
								/* Inline comments */
								break;
							}
							zIn++;
						}
					}
					/* Trim the value */
					SyStringInitFromBuf(&sEntry, zCur, (int)(zIn-zCur));
					SyStringFullTrim(&sEntry);
					if( c == '"' || c == '\'' ){
						SyStringTrimLeadingChar(&sEntry, c);
						SyStringTrimTrailingChar(&sEntry, c);
					}
					if( sEntry.nByte > 0 ){
						jx9_value_string(pValue, sEntry.zString, (int)sEntry.nByte);
					}
					/* Insert the key and it's value */
					jx9_array_add_elem(pCur, is_array ? 0 /*Automatic index assign */: pWorker, pValue);
				}
			}else{
				while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && ( SyisSpace(zIn[0]) || zIn[0] == '=' ) ){
					zIn++;
				}
			}
			pCur = pOldCur;
		}
	}
	SyHashRelease(&sHash);
	/* Return the parse of the INI string */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}